

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::ItemFromNameHash
          (ON_ComponentManifest *this,Type component_type,ON_NameHash *component_name_hash)

{
  ON_ComponentManifestItem *pOVar1;
  
  if (this->m_impl == (ON_ComponentManifestImpl *)0x0) {
    pOVar1 = (ON_ComponentManifestItem *)0x0;
  }
  else {
    pOVar1 = &ON_ComponentManifestImpl::ItemFromNameHash
                        (this->m_impl,component_type,component_name_hash)->
              super_ON_ComponentManifestItem;
  }
  if ((ON_ComponentManifestItem_PRIVATE *)pOVar1 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar1 = &ON_ComponentManifestItem::UnsetItem;
  }
  return pOVar1;
}

Assistant:

const class ON_ComponentManifestItem& ON_ComponentManifest::ItemFromNameHash(
  ON_ModelComponent::Type component_type,
  const ON_NameHash& component_name_hash
  ) const
{
  const ON_ComponentManifestItem_PRIVATE* item
    = (nullptr != m_impl)
    ? m_impl->ItemFromNameHash(component_type,component_name_hash)
    : nullptr;
  return
    (nullptr != item )
    ? *item
    : ON_ComponentManifestItem::UnsetItem;
}